

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst_avx2.c
# Opt level: O0

uint8_t calc_dgd_buf_avg_avx2
                  (uint8_t *src,int32_t h_start,int32_t h_end,int32_t v_start,int32_t v_end,
                  int32_t stride)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  __m256i src_00;
  undefined1 auVar3 [16];
  uint uVar4;
  uint uVar5;
  undefined1 (*pauVar6) [32];
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  undefined1 auVar7 [16];
  uint8_t avg;
  uint32_t sum;
  __m256i sad_0_1;
  __m256i s_m_0;
  __m256i s_0_1;
  __m256i sad_0;
  __m256i s_0;
  int32_t proc_wd;
  int32_t proc_ht;
  __m256i mask;
  __m256i ss;
  __m128i mask_high;
  __m128i mask_low;
  int32_t wd_mul32;
  int32_t wd_beyond_mul32;
  int32_t height;
  int32_t width;
  __m256i zero;
  uint8_t *src_temp;
  undefined8 in_stack_fffffffffffffc78;
  undefined8 in_stack_fffffffffffffc80;
  undefined8 in_stack_fffffffffffffc88;
  longlong in_stack_fffffffffffffc90;
  int local_308;
  int local_304;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined1 local_2e0 [32];
  undefined8 local_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  long local_248;
  undefined8 uStack_138;
  undefined8 local_50;
  undefined8 uStack_48;
  
  local_248 = in_RDI + in_ECX * in_R9D + (long)in_ESI;
  uVar4 = in_EDX - in_ESI;
  uVar5 = uVar4 & 0x1f;
  local_2e0 = ZEXT1632(ZEXT816(0));
  if (uVar5 < 0x10) {
    local_2a0 = *(undefined8 *)(mask_8bit + (int)(0x10 - uVar5));
    uStack_298 = *(undefined8 *)(mask_8bit + (long)(int)(0x10 - uVar5) + 8);
    uStack_138 = SUB168(ZEXT816(0),4);
    local_2b0 = 0;
    uStack_2a8 = uStack_138;
  }
  else {
    auVar1 = vpinsrb_avx(ZEXT116(0xff),0xff,1);
    auVar1 = vpinsrb_avx(auVar1,0xff,2);
    auVar1 = vpinsrb_avx(auVar1,0xff,3);
    auVar1 = vpinsrb_avx(auVar1,0xff,4);
    auVar1 = vpinsrb_avx(auVar1,0xff,5);
    auVar1 = vpinsrb_avx(auVar1,0xff,6);
    auVar1 = vpinsrb_avx(auVar1,0xff,7);
    auVar1 = vpinsrb_avx(auVar1,0xff,8);
    auVar1 = vpinsrb_avx(auVar1,0xff,9);
    auVar1 = vpinsrb_avx(auVar1,0xff,10);
    auVar1 = vpinsrb_avx(auVar1,0xff,0xb);
    auVar1 = vpinsrb_avx(auVar1,0xff,0xc);
    auVar1 = vpinsrb_avx(auVar1,0xff,0xd);
    auVar1 = vpinsrb_avx(auVar1,0xff,0xe);
    auVar1 = vpinsrb_avx(auVar1,0xff,0xf);
    local_50 = auVar1._0_8_;
    uStack_48 = auVar1._8_8_;
    local_2a0 = local_50;
    uStack_298 = uStack_48;
    local_2b0 = *(undefined8 *)(mask_8bit + (int)(0x20 - uVar5));
    uStack_2a8 = *(undefined8 *)(mask_8bit + (long)(int)(0x20 - uVar5) + 8);
  }
  auVar3._8_8_ = uStack_298;
  auVar3._0_8_ = local_2a0;
  auVar1._8_8_ = uStack_2a8;
  auVar1._0_8_ = local_2b0;
  auVar7 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar1;
  local_304 = 0;
  do {
    for (local_308 = 0; local_308 < (int)(uVar4 - uVar5); local_308 = local_308 + 0x20) {
      auVar2 = vpsadbw_avx2(*(undefined1 (*) [32])(local_248 + local_308),ZEXT1632(ZEXT816(0)));
      local_2e0 = vpaddd_avx2(local_2e0,auVar2);
    }
    if (uVar5 != 0) {
      pauVar6 = (undefined1 (*) [32])(local_248 + local_308);
      in_stack_fffffffffffffc80 = *(undefined8 *)*pauVar6;
      in_stack_fffffffffffffc88 = *(undefined8 *)(*pauVar6 + 8);
      in_stack_fffffffffffffc90 = *(longlong *)(*pauVar6 + 0x10);
      uStack_2f0 = auVar7._0_8_;
      uStack_2e8 = auVar7._8_8_;
      auVar2._16_8_ = uStack_2f0;
      auVar2._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar3;
      auVar2._24_8_ = uStack_2e8;
      auVar2 = vpand_avx2(*pauVar6,auVar2);
      in_stack_fffffffffffffc78 = auVar2._24_8_;
      auVar2 = vpsadbw_avx2(auVar2,ZEXT1632(ZEXT816(0)));
      local_2e0 = vpaddd_avx2(local_2e0,auVar2);
    }
    local_248 = local_248 + in_R9D;
    local_304 = local_304 + 1;
  } while (local_304 < in_R8D - in_ECX);
  src_00[1] = in_stack_fffffffffffffc80;
  src_00[0] = in_stack_fffffffffffffc78;
  src_00[2] = in_stack_fffffffffffffc88;
  src_00[3] = in_stack_fffffffffffffc90;
  uVar5 = calc_sum_of_register(src_00);
  return (uint8_t)(uVar5 / (uVar4 * (in_R8D - in_ECX)));
}

Assistant:

static inline uint8_t calc_dgd_buf_avg_avx2(const uint8_t *src, int32_t h_start,
                                            int32_t h_end, int32_t v_start,
                                            int32_t v_end, int32_t stride) {
  const uint8_t *src_temp = src + v_start * stride + h_start;
  const __m256i zero = _mm256_setzero_si256();
  const int32_t width = h_end - h_start;
  const int32_t height = v_end - v_start;
  const int32_t wd_beyond_mul32 = width & 31;
  const int32_t wd_mul32 = width - wd_beyond_mul32;
  __m128i mask_low, mask_high;
  __m256i ss = zero;

  // When width is not multiple of 32, it still loads 32 and to make the data
  // which is extra (beyond required) as zero using the below mask.
  if (wd_beyond_mul32 >= 16) {
    mask_low = _mm_set1_epi8(-1);
    mask_high = _mm_loadu_si128((__m128i *)(&mask_8bit[32 - wd_beyond_mul32]));
  } else {
    mask_low = _mm_loadu_si128((__m128i *)(&mask_8bit[16 - wd_beyond_mul32]));
    mask_high = _mm_setzero_si128();
  }
  const __m256i mask =
      _mm256_inserti128_si256(_mm256_castsi128_si256(mask_low), mask_high, 1);

  int32_t proc_ht = 0;
  do {
    // Process width in multiple of 32.
    int32_t proc_wd = 0;
    while (proc_wd < wd_mul32) {
      const __m256i s_0 = _mm256_loadu_si256((__m256i *)(src_temp + proc_wd));
      const __m256i sad_0 = _mm256_sad_epu8(s_0, zero);
      ss = _mm256_add_epi32(ss, sad_0);
      proc_wd += 32;
    }

    // Process the remaining width.
    if (wd_beyond_mul32) {
      const __m256i s_0 = _mm256_loadu_si256((__m256i *)(src_temp + proc_wd));
      const __m256i s_m_0 = _mm256_and_si256(s_0, mask);
      const __m256i sad_0 = _mm256_sad_epu8(s_m_0, zero);
      ss = _mm256_add_epi32(ss, sad_0);
    }
    src_temp += stride;
    proc_ht++;
  } while (proc_ht < height);

  const uint32_t sum = calc_sum_of_register(ss);
  const uint8_t avg = sum / (width * height);
  return avg;
}